

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O1

bool __thiscall qpdf::Array::setAt(Array *this,int at,QPDFObjectHandle *oh)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  QPDF_Array *pQVar2;
  mapped_type *pmVar3;
  int iVar4;
  int local_24;
  
  if (-1 < at) {
    local_24 = at;
    pQVar2 = array(this);
    _Var1._M_head_impl =
         (pQVar2->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (Sparse *)0x0) {
      iVar4 = (int)((ulong)((long)(pQVar2->elements).
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pQVar2->elements).
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    else {
      iVar4 = (_Var1._M_head_impl)->size;
    }
    if (at < iVar4) {
      pQVar2 = array(this);
      checkOwnership(this,oh);
      _Var1._M_head_impl =
           (pQVar2->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      if (_Var1._M_head_impl == (Sparse *)0x0) {
        pmVar3 = (pQVar2->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start + local_24;
      }
      else {
        pmVar3 = std::
                 map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                 ::operator[](&(_Var1._M_head_impl)->elements,&local_24);
      }
      (pmVar3->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar3->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(oh->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return true;
    }
  }
  return false;
}

Assistant:

bool
Array::setAt(int at, QPDFObjectHandle const& oh)
{
    if (at < 0 || at >= size()) {
        return false;
    }
    auto a = array();
    checkOwnership(oh);
    if (a->sp) {
        a->sp->elements[at] = oh;
    } else {
        a->elements[size_t(at)] = oh;
    }
    return true;
}